

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  int iVar1;
  format_specs *pfVar2;
  format_specs *specs_00;
  byte bVar3;
  bool bVar4;
  int iVar5;
  make_unsigned_t<int> mVar6;
  uint uVar7;
  basic_appender<char> bVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  digit_grouping<char> *this;
  uint uVar12;
  char cVar13;
  long lVar14;
  locale_ref in_stack_fffffffffffffed8;
  char local_11e;
  char zero;
  bool pointy;
  undefined3 uStack_11b;
  int significand_size;
  sign s_local;
  ulong local_110;
  basic_appender<char> local_108;
  format_specs *local_100;
  significand_type significand;
  int local_ec;
  sign local_e8;
  int exp;
  locale_ref local_e0;
  significand_type local_d8;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined4 uStack_84;
  significand_type *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  digit_grouping<char> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_class_24_3_3ccdf9fd use_exp_format;
  
  significand = f->significand;
  s_local = s;
  local_108.container = out.container;
  local_d8 = significand;
  iVar5 = get_significand_size<double>(f);
  zero = '0';
  significand_size = iVar5;
  mVar6 = to_unsigned<int>(iVar5);
  local_110 = (ulong)((mVar6 + 1) - (uint)(s == none));
  uVar7 = 0x2e;
  local_100 = specs;
  local_e8 = s;
  if (((specs->super_basic_specs).data_ & 0x4000) != 0) {
    bVar3 = decimal_point_impl<char>(in_stack_fffffffffffffed8);
    uVar7 = (uint)bVar3;
  }
  pfVar2 = local_100;
  cVar13 = (char)uVar7;
  iVar10 = f->exponent;
  local_ec = iVar5 + iVar10 + -1;
  use_exp_format.specs.super_basic_specs = local_100->super_basic_specs;
  use_exp_format.specs.width = local_100->width;
  use_exp_format.specs.precision = local_100->precision;
  local_11e = cVar13;
  local_e0.locale_ = loc.locale_;
  use_exp_format.output_exp = local_ec;
  use_exp_format.exp_upper = exp_upper;
  bVar4 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()(&use_exp_format);
  specs_00 = local_100;
  uVar9 = local_110;
  if (bVar4) {
    iVar10 = iVar10 + iVar5;
    if (((pfVar2->super_basic_specs).data_ & 0x2000) == 0) {
      uVar12 = 0;
      if (iVar5 == 1) {
        uVar7 = uVar12;
      }
      cVar13 = (char)uVar7;
    }
    else {
      uVar7 = pfVar2->precision - iVar5;
      uVar12 = 0;
      if (0 < (int)uVar7) {
        uVar12 = uVar7;
      }
      mVar6 = to_unsigned<int>(uVar12);
      uVar9 = local_110 + mVar6;
    }
    iVar1 = local_ec;
    iVar11 = 1 - iVar10;
    if (0 < iVar10) {
      iVar11 = local_ec;
    }
    iVar10 = 2;
    if (99 < iVar11) {
      iVar10 = (999 < iVar11) + 3;
    }
    mVar6 = to_unsigned<int>((3 - (uint)(cVar13 == '\0')) + iVar10);
    write.s = local_e8;
    write.significand = local_d8;
    write.decimal_point = cVar13;
    write.significand_size = iVar5;
    write._24_5_ = CONCAT14('0',uVar12);
    write._24_8_ = CONCAT26(write._30_2_,
                            CONCAT15((((pfVar2->super_basic_specs).data_ >> 0xc & 1) == 0) << 5,
                                     write._24_5_)) | 0x450000000000;
    write.output_exp = iVar1;
    if (0 < pfVar2->width) {
      bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (local_108,pfVar2,mVar6 + uVar9,&write);
      return (basic_appender<char>)bVar8.container;
    }
    bVar8 = reserve<char>(local_108,mVar6 + uVar9);
    bVar8 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
            ::anon_class_40_8_fd1bf2f9::operator()(&write,bVar8.container);
    return (basic_appender<char>)bVar8.container;
  }
  iVar11 = f->exponent;
  iVar10 = iVar5 + iVar11;
  exp = iVar10;
  if (-1 < iVar11) {
    mVar6 = to_unsigned<int>(iVar11);
    pfVar2 = local_100;
    lVar14 = mVar6 + local_110;
    _pointy = local_100->precision - iVar10;
    uVar7 = (local_100->super_basic_specs).data_;
    if ((uVar7 >> 0xd & 1) != 0) {
      lVar14 = lVar14 + 1;
      if ((uVar7 & 7) == 2 || 0 < (int)_pointy) {
        if (0 < (int)_pointy) {
          mVar6 = to_unsigned<int>(_pointy);
          lVar14 = lVar14 + (ulong)mVar6;
          uVar7 = (pfVar2->super_basic_specs).data_;
        }
      }
      else {
        _pointy = 0;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&num_zeros,local_e0,(bool)((byte)(uVar7 >> 0xe) & 1));
    iVar5 = digit_grouping<char>::count_separators((digit_grouping<char> *)&num_zeros,iVar10);
    mVar6 = to_unsigned<int>(iVar5);
    write._0_8_ = &s_local;
    write.significand = (significand_type)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = f;
    write._32_8_ = (digit_grouping<char> *)&num_zeros;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                      (local_108,local_100,lVar14 + (ulong)mVar6,(anon_class_72_9_eb40e20e *)&write)
    ;
    this = (digit_grouping<char> *)&num_zeros;
LAB_001b5c57:
    digit_grouping<char>::~digit_grouping(this);
    return (basic_appender<char>)bVar8.container;
  }
  if (0 < iVar10) {
    uVar7 = (local_100->super_basic_specs).data_;
    uVar12 = local_100->precision - iVar5 & (int)(uVar7 << 0x12) >> 0x1f;
    _pointy = uVar12;
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&write,local_e0,(bool)((byte)(uVar7 >> 0xe) & 1));
    iVar5 = digit_grouping<char>::count_separators((digit_grouping<char> *)&write,iVar10);
    uVar9 = 0;
    if (0 < (int)uVar12) {
      uVar9 = (ulong)uVar12;
    }
    lVar14 = uVar9 + local_110;
    mVar6 = to_unsigned<int>(iVar5);
    _num_zeros = (pointer)&s_local;
    local_80 = &significand;
    local_78._M_allocated_capacity = (size_type)&significand_size;
    local_78._8_8_ = &exp;
    local_68._M_p = &local_11e;
    local_58._M_allocated_capacity = (size_type)&pointy;
    local_58._8_8_ = &zero;
    local_60 = (digit_grouping<char> *)&write;
    bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                      (local_108,specs_00,(ulong)mVar6 + lVar14 + 1,
                       (anon_class_64_8_085c650e *)&num_zeros);
    this = (digit_grouping<char> *)&write;
    goto LAB_001b5c57;
  }
  iVar11 = -iVar10;
  num_zeros = iVar11;
  if ((iVar5 == 0) &&
     (iVar1 = local_100->precision, SBORROW4(iVar1,iVar11) != iVar1 + iVar10 < 0 && -1 < iVar1)) {
    num_zeros = iVar1;
    iVar11 = iVar1;
  }
  if (iVar5 == 0 && iVar11 == 0) {
    uVar7 = (local_100->super_basic_specs).data_ & 0x2000;
    _pointy = CONCAT31(uStack_11b,(char)(uVar7 >> 0xd));
    if (uVar7 == 0) {
      iVar5 = 1;
      goto LAB_001b5cbe;
    }
  }
  else {
    _pointy = CONCAT31(uStack_11b,1);
  }
  iVar5 = 2;
LAB_001b5cbe:
  mVar6 = to_unsigned<int>(iVar11);
  write._0_8_ = &s_local;
  write.significand = (significand_type)&pointy;
  write._16_8_ = &local_11e;
  write._24_8_ = &num_zeros;
  write._32_8_ = &zero;
  bVar8 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                    (local_108,local_100,(iVar5 + mVar6) + uVar9,(anon_class_56_7_88befd79 *)&write)
  ;
  return (basic_appender<char>)bVar8.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}